

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sljitNativeX86_64.c
# Opt level: O3

sljit_s32 emit_do_imm32(sljit_compiler *compiler,sljit_u8 rex,sljit_u8 opcode,sljit_sw imm)

{
  sljit_s32 sVar1;
  undefined1 *puVar2;
  sljit_u8 *psVar3;
  uint uVar4;
  undefined7 in_register_00000031;
  
  uVar4 = (uint)((int)CONCAT71(in_register_00000031,rex) == 0);
  puVar2 = (undefined1 *)ensure_buf(compiler,(ulong)(uVar4 ^ 7));
  if (puVar2 == (undefined1 *)0x0) {
    sVar1 = compiler->error;
  }
  else {
    uVar4 = 6 - uVar4;
    *puVar2 = (char)uVar4;
    compiler->size = compiler->size + (ulong)uVar4;
    if (rex == '\0') {
      psVar3 = puVar2 + 1;
    }
    else {
      puVar2[1] = rex;
      psVar3 = puVar2 + 2;
    }
    *psVar3 = opcode;
    *(int *)(psVar3 + 1) = (int)imm;
    sVar1 = 0;
  }
  return sVar1;
}

Assistant:

static sljit_s32 emit_do_imm32(struct sljit_compiler *compiler, sljit_u8 rex, sljit_u8 opcode, sljit_sw imm)
{
	sljit_u8 *inst;
	sljit_s32 length = 1 + (rex ? 1 : 0) + sizeof(sljit_s32);

	inst = (sljit_u8*)ensure_buf(compiler, 1 + length);
	FAIL_IF(!inst);
	INC_SIZE(length);
	if (rex)
		*inst++ = rex;
	*inst++ = opcode;
	sljit_unaligned_store_s32(inst, imm);
	return SLJIT_SUCCESS;
}